

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

int duckdb_brotli::SafeDecodeCommandBlockSwitch(BrotliDecoderStateInternal *s)

{
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  long in_RDI;
  bool bVar4;
  BrotliBitReaderState memento;
  uint64_t block_type;
  uint64_t *ringbuffer;
  BrotliBitReader *br;
  HuffmanCode *len_tree;
  HuffmanCode *type_tree;
  uint64_t max_block_type;
  uint64_t offset;
  uint64_t nbits_5;
  uint64_t bits;
  uint64_t index;
  uint64_t val_2;
  uint64_t val_1;
  uint64_t nbits_3;
  uint64_t nbits_4;
  uint64_t nbits;
  uint64_t nbits_1;
  uint64_t code;
  uint64_t nbits_2;
  uint64_t val;
  uint64_t bit_pos_2;
  uint32_t t_2;
  uint64_t bit_pos_1;
  uint32_t t_1;
  uint64_t bit_pos;
  uint32_t t;
  uint8_t *local_790;
  uint local_6dc;
  uint64_t local_6d8;
  uint64_t local_6d0;
  uint8_t *local_6c8;
  long local_6c0;
  ulong local_6b8;
  ulong *local_6b0;
  BrotliBitReader *local_6a8;
  HuffmanCode *local_6a0;
  HuffmanCode *local_698;
  ulong local_690;
  int local_684;
  long local_680;
  undefined4 local_678;
  ulong local_660;
  ulong local_658;
  BrotliBitReader *local_650;
  HuffmanCode *local_648;
  long *local_640;
  long local_638;
  ulong local_590;
  uint64_t *local_588;
  BrotliBitReader *local_580;
  HuffmanCode *local_578;
  int local_56c;
  ulong *local_568;
  undefined8 local_560;
  BrotliBitReader *local_558;
  int local_54c;
  undefined8 local_548;
  undefined8 local_540;
  BrotliBitReader *local_538;
  BrotliBitReader *local_530;
  BrotliBitReader *local_528;
  uint local_51c;
  uint64_t local_518;
  undefined8 local_510;
  ulong local_508;
  ulong local_500;
  ulong local_4f8;
  uint64_t *local_4f0;
  BrotliBitReader *local_4e8;
  HuffmanCode *local_4e0;
  int local_4d4;
  ulong *local_4d0;
  undefined8 local_4c8;
  BrotliBitReader *local_4c0;
  int local_4b4;
  undefined8 local_4b0;
  undefined8 local_4a8;
  BrotliBitReader *local_4a0;
  BrotliBitReader *local_498;
  BrotliBitReader *local_490;
  uint local_484;
  undefined8 local_480;
  undefined8 local_478;
  ulong local_470;
  ulong local_468;
  ulong local_460;
  BrotliBitReader *local_458;
  HuffmanCode *local_450;
  ulong local_448;
  ulong local_440;
  ulong local_438;
  ulong local_430;
  BrotliBitReader *local_428;
  undefined8 local_420;
  BrotliBitReader *local_418;
  HuffmanCode *local_400;
  uint64_t *local_2e0;
  BrotliBitReader *local_2d8;
  BrotliBitReader *local_2d0;
  
  local_678 = 1;
  local_684 = 1;
  local_690 = *(ulong *)(in_RDI + 0x140);
  local_698 = (HuffmanCode *)(*(long *)(in_RDI + 0x100) + 0x9e0);
  local_6a0 = (HuffmanCode *)(*(long *)(in_RDI + 0x108) + 0x630);
  local_6a8 = (BrotliBitReader *)(in_RDI + 8);
  local_6b0 = (ulong *)(in_RDI + 0x160);
  if (local_690 < 2) {
    bVar4 = false;
    goto LAB_00845a75;
  }
  local_2e0 = &local_6d8;
  local_6d8 = local_6a8->val_;
  local_6d0 = *(uint64_t *)(in_RDI + 0x10);
  local_6c8 = *(uint8_t **)(in_RDI + 0x18);
  local_6c0 = *(long *)(in_RDI + 0x28) - *(long *)(in_RDI + 0x18);
  local_4f0 = &local_6b8;
  local_4c8 = 0xf;
  local_4d0 = &local_4f8;
  do {
    if (0xe < *(ulong *)(in_RDI + 0x10)) {
      local_4b0 = 0xf;
      local_4a8 = 0x7fff;
      local_4f8 = local_6a8->val_ & 0x7fff;
      local_4b4 = 1;
      local_498 = local_6a8;
      goto LAB_00844e89;
    }
    bVar4 = *(long *)(in_RDI + 0x18) != *(long *)(in_RDI + 0x28);
    if (bVar4) {
      local_468 = local_6a8->val_;
      local_470 = (ulong)**(byte **)(in_RDI + 0x18);
      local_480 = *(undefined8 *)(in_RDI + 0x10);
      local_478 = 8;
      local_6a8->val_ = local_468 | local_470 << ((byte)local_480 & 0x3f);
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 8;
      *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
    }
    local_484 = (uint)bVar4;
    local_490 = local_6a8;
  } while (local_484 != 0);
  local_4b4 = 0;
LAB_00844e89:
  local_680 = in_RDI;
  local_4e8 = local_6a8;
  local_4e0 = local_698;
  local_4c0 = local_6a8;
  local_4a0 = local_6a8;
  local_2d8 = local_6a8;
  local_2d0 = local_6a8;
  if (local_4b4 == 0) {
    local_4d4 = SafeDecodeSymbol(local_698,local_6a8,local_4f0);
  }
  else {
    local_448 = local_4f8;
    local_450 = local_698 + (local_4f8 & 0xff);
    if (8 < local_450->bits) {
      local_460 = (ulong)(local_450->bits - 8);
      local_420 = 8;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + -8;
      local_6a8->val_ = local_6a8->val_ >> 8;
      local_438 = *(ulong *)(kBrotliBitMask + local_460 * 8);
      local_450 = local_450 + (ulong)local_450->value + (local_4f8 >> 8 & local_438);
      local_440 = local_460;
      local_418 = local_6a8;
    }
    bVar1 = local_450->bits;
    local_430 = (ulong)bVar1;
    *(ulong *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - local_430;
    local_6a8->val_ = local_6a8->val_ >> (bVar1 & 0x3f);
    local_6b8 = (ulong)local_450->value;
    local_4d4 = 1;
    local_458 = local_6a8;
    local_428 = local_6a8;
  }
  if (local_4d4 == 0) {
    bVar4 = false;
    goto LAB_00845a75;
  }
  local_640 = (long *)(local_680 + 0x118 + (long)local_684 * 8);
  local_638 = local_680;
  local_648 = local_6a0;
  local_650 = local_6a8;
  if (*(int *)(local_680 + 0x2fc) == 0) {
    local_578 = local_6a0;
    local_580 = local_6a8;
    local_588 = &local_658;
    local_558 = local_6a8;
    local_560 = 0xf;
    local_568 = &local_590;
    do {
      local_538 = local_6a8;
      if (0xe < local_6a8->bit_pos_) {
        local_530 = local_6a8;
        local_548 = 0xf;
        local_540 = 0x7fff;
        local_590 = local_6a8->val_ & 0x7fff;
        local_54c = 1;
        goto LAB_00845309;
      }
      local_528 = local_6a8;
      bVar4 = local_6a8->next_in != local_6a8->last_in;
      if (bVar4) {
        local_500 = local_6a8->val_;
        local_508 = (ulong)*local_6a8->next_in;
        local_518 = local_6a8->bit_pos_;
        local_510 = 8;
        local_6a8->val_ = local_500 | local_508 << ((byte)local_518 & 0x3f);
        local_6a8->bit_pos_ = local_6a8->bit_pos_ + 8;
        local_6a8->next_in = local_6a8->next_in + 1;
      }
      local_51c = (uint)bVar4;
    } while (local_51c != 0);
    local_54c = 0;
LAB_00845309:
    if (local_54c == 0) {
      local_56c = SafeDecodeSymbol(local_6a0,local_6a8,local_588);
    }
    else {
      local_400 = local_6a0 + (local_590 & 0xff);
      if (8 < local_400->bits) {
        bVar1 = local_400->bits;
        local_6a8->bit_pos_ = local_6a8->bit_pos_ - 8;
        local_6a8->val_ = local_6a8->val_ >> 8;
        local_400 = local_400 +
                    (ulong)local_400->value +
                    (local_590 >> 8 & *(ulong *)(kBrotliBitMask + (ulong)(bVar1 - 8) * 8));
      }
      bVar1 = local_400->bits;
      local_6a8->bit_pos_ = local_6a8->bit_pos_ - (ulong)bVar1;
      local_6a8->val_ = local_6a8->val_ >> (bVar1 & 0x3f);
      local_658 = (ulong)local_400->value;
      local_56c = 1;
    }
    if (local_56c != 0) goto LAB_0084553b;
    bVar4 = false;
  }
  else {
    local_658 = *(ulong *)(local_680 + 0x130);
LAB_0084553b:
    bVar1 = _kBrotliPrefixCodeRanges[local_658 * 4 + 2];
    uVar3 = (ulong)bVar1;
    uVar2 = *(ushort *)(_kBrotliPrefixCodeRanges + local_658 * 4);
    while (local_650->bit_pos_ < uVar3) {
      if (local_650->next_in == local_650->last_in) {
        bVar4 = false;
        goto LAB_008457cc;
      }
      local_650->val_ =
           local_650->val_ | (ulong)*local_650->next_in << ((byte)local_650->bit_pos_ & 0x3f);
      local_650->bit_pos_ = local_650->bit_pos_ + 8;
      local_650->next_in = local_650->next_in + 1;
    }
    local_660 = local_650->val_ & *(ulong *)(kBrotliBitMask + uVar3 * 8);
    local_650->bit_pos_ = local_650->bit_pos_ - uVar3;
    local_650->val_ = local_650->val_ >> (bVar1 & 0x3f);
    bVar4 = true;
LAB_008457cc:
    if (bVar4) {
      *local_640 = uVar2 + local_660;
      *(undefined4 *)(local_638 + 0x2fc) = 0;
      bVar4 = true;
    }
    else {
      *(ulong *)(local_638 + 0x130) = local_658;
      *(undefined4 *)(local_638 + 0x2fc) = 1;
      bVar4 = false;
    }
  }
  if (bVar4) {
    if (local_6b8 == 1) {
      local_6b8 = local_6b0[1] + 1;
    }
    else if (local_6b8 == 0) {
      local_6b8 = *local_6b0;
    }
    else {
      local_6b8 = local_6b8 - 2;
    }
    if (local_690 <= local_6b8) {
      local_6b8 = local_6b8 - local_690;
    }
    *local_6b0 = local_6b0[1];
    local_6b0[1] = local_6b8;
    bVar4 = true;
  }
  else {
    *(undefined4 *)(local_680 + 0x2fc) = 0;
    local_6a8->val_ = local_6d8;
    local_6a8->bit_pos_ = local_6d0;
    local_6a8->next_in = local_6c8;
    local_790 = local_6c8;
    local_6a8->next_in = local_6c8;
    if (local_6c0 != 0) {
      local_790 = local_6c8 + local_6c0;
    }
    local_6a8->last_in = local_790;
    if (local_6c0 + 1U < 0x1d) {
      local_6a8->guard_in = local_6c8;
    }
    else {
      local_6a8->guard_in = local_6c8 + local_6c0 + -0x1b;
    }
    bVar4 = false;
  }
LAB_00845a75:
  if (bVar4) {
    *(undefined8 *)(in_RDI + 0x98) =
         *(undefined8 *)(*(long *)(in_RDI + 0xd0) + *(long *)(in_RDI + 0x168) * 8);
  }
  local_6dc = (uint)bVar4;
  return local_6dc;
}

Assistant:

static BROTLI_BOOL BROTLI_NOINLINE SafeDecodeCommandBlockSwitch(BrotliDecoderState *s) {
	return DecodeCommandBlockSwitchInternal(1, s);
}